

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O2

void __thiscall
dg::llvmdg::SDGBuilder::buildBBlock(SDGBuilder *this,DependenceGraph *dg,BasicBlock *B)

{
  CallInst *CI;
  DGBBlock *dgb;
  DepDGElement *this_00;
  DepDGElement *nd;
  BasicBlock *pBVar1;
  
  dgb = sdg::DependenceGraph::createBBlock(dg);
  SystemDependenceGraph::addBlkMapping(this->_llvmsdg,B,dgb);
  pBVar1 = B + 0x30;
  do {
    pBVar1 = *(BasicBlock **)pBVar1;
    if (pBVar1 == B + 0x28) {
      return;
    }
    CI = (CallInst *)(pBVar1 + -0x18);
    if (pBVar1 == (BasicBlock *)0x0) {
      CI = (CallInst *)0x0;
LAB_0010bd1b:
      this_00 = (DepDGElement *)sdg::DependenceGraph::createInstruction(dg);
      if (CI[0x10] == (CallInst)0x1c) {
        nd = (DepDGElement *)(dg->_parameters).super_DGParameters._return;
        if (nd == (DepDGElement *)0x0) {
          nd = (DepDGElement *)::dg::sdg::DGParameters::createReturn();
        }
        sdg::DepDGElement::addUser(this_00,nd);
      }
    }
    else {
      if (pBVar1[-8] != (BasicBlock)0x53) goto LAB_0010bd1b;
      this_00 = (DepDGElement *)buildCallNode(this,dg,CI);
    }
    sdg::DGBBlock::append(dgb,(DGNode *)this_00);
    SystemDependenceGraph::addMapping(this->_llvmsdg,(Value *)CI,&this_00->super_DGElement);
    pBVar1 = pBVar1 + 8;
  } while( true );
}

Assistant:

void buildBBlock(sdg::DependenceGraph &dg, llvm::BasicBlock &B) {
        auto &block = dg.createBBlock();
        _llvmsdg->addBlkMapping(&B, &block);

        for (auto &I : B) {
            sdg::DGNode *node = nullptr;
            if (auto *CI = llvm::dyn_cast<llvm::CallInst>(&I)) {
                node = &buildCallNode(dg, CI);
            } else {
                node = &dg.createInstruction();
                if (llvm::isa<llvm::ReturnInst>(I)) {
                    // add formal 'ret' parameter
                    auto &params = dg.getParameters();
                    auto *ret = params.getReturn();
                    if (!ret)
                        ret = &params.createReturn();
                    // XXX: do we want the 'use' edge here?
                    node->addUser(*ret);
                }
            }
            assert(node && "Failed creating a node");

            block.append(node);
            _llvmsdg->addMapping(&I, node);
        }
    }